

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O2

void avro::codec_traits<uau::r1>::decode(Decoder *d,r1 *v)

{
  long *plVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  plVar1 = (long *)__dynamic_cast(d,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  if (plVar1 != (long *)0x0) {
    __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          (**(code **)(*plVar1 + 0xb8))(plVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,__x);
    for (puVar2 = local_30._M_impl.super__Vector_impl_data._M_start;
        puVar2 != local_30._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      if (*puVar2 == 0) {
        codec_traits<uau::_union_array_union_Union__1__>::decode(d,&v->f1);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
    return;
  }
  codec_traits<uau::_union_array_union_Union__1__>::decode(d,&v->f1);
  return;
}

Assistant:

static void decode(Decoder& d, uau::r1& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.f1);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.f1);
        }
    }